

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O2

void eltcalc::setinitdone(int processid)

{
  ostream *poVar1;
  ostringstream s;
  string sStack_1a8;
  ostringstream local_188 [376];
  
  if (processid != 0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    poVar1 = std::operator<<((ostream *)local_188,"work/sema");
    poVar1 = std::operator<<(poVar1,"_elt/");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,processid);
    std::operator<<(poVar1,".id");
    std::__cxx11::stringbuf::str();
    touch(&sStack_1a8);
    std::__cxx11::string::~string((string *)&sStack_1a8);
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  return;
}

Assistant:

void setinitdone(int processid)
	{
		if (processid) {
			std::ostringstream s;
			s << SEMA_DIR_PREFIX << "_elt/" << processid << ".id";
			touch(s.str());
		}
	}